

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall embree::Stream<int>::drop(Stream<int> *this)

{
  long lVar1;
  runtime_error *this_00;
  long *in_RDI;
  size_t end;
  int v;
  ParseLocation l;
  int *in_stack_fffffffffffffef8;
  pair<int,_embree::ParseLocation> *__p;
  pair<int,_embree::ParseLocation> *in_stack_ffffffffffffff00;
  pair<int,_embree::ParseLocation> local_a8;
  ulong local_78;
  pair<int,_embree::ParseLocation> *local_70;
  undefined4 local_4c;
  undefined1 local_48 [40];
  pair<int,_embree::ParseLocation> *local_20;
  
  if (in_RDI[4] == 0) {
    local_20 = &local_a8;
    (**(code **)(*in_RDI + 0x28))(local_48);
    local_4c = (**(code **)(*in_RDI + 0x20))();
    std::pair<int,_embree::ParseLocation>::pair<int_&,_embree::ParseLocation_&,_true>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(ParseLocation *)0x478c58);
    ParseLocation::~ParseLocation((ParseLocation *)0x478c9a);
    __p = &local_a8;
    local_70 = __p;
    if (in_RDI[3] + in_RDI[4] == 0x400) {
      if (in_RDI[3] == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RDI[2] = in_RDI[2] + 1U & 0x3ff;
      in_RDI[3] = in_RDI[3] + -1;
    }
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + 1;
    local_78 = in_RDI[2] + in_RDI[3] + lVar1 & 0x3ff;
    std::
    vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
    ::operator[]((vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
                  *)(in_RDI + 5),local_78);
    std::pair<int,_embree::ParseLocation>::operator=(in_stack_ffffffffffffff00,__p);
    std::pair<int,_embree::ParseLocation>::~pair((pair<int,_embree::ParseLocation> *)0x478df4);
  }
  in_RDI[3] = in_RDI[3] + 1;
  in_RDI[4] = in_RDI[4] + -1;
  return;
}

Assistant:

void drop() {
      if (future == 0) push_back(nextHelper());
      past++; future--;
    }